

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O1

bool __thiscall CScript::IsPayToScriptHash(CScript *this)

{
  uint uVar1;
  uint uVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  uVar1 = (this->super_CScriptBase)._size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  if (uVar2 == 0x17) {
    if (0x1c < uVar1) {
      this = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    }
    if (((this->super_CScriptBase)._union.direct[0] == -0x57) &&
       ((this->super_CScriptBase)._union.direct[1] == '\x14')) {
      bVar3 = (this->super_CScriptBase)._union.direct[0x16] == -0x79;
      goto LAB_0077638c;
    }
  }
  bVar3 = false;
LAB_0077638c:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CScript::IsPayToScriptHash() const
{
    // Extra-fast test for pay-to-script-hash CScripts:
    return (this->size() == 23 &&
            (*this)[0] == OP_HASH160 &&
            (*this)[1] == 0x14 &&
            (*this)[22] == OP_EQUAL);
}